

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

QRect __thiscall QStyle::itemPixmapRect(QStyle *this,QRect *rect,int alignment,QPixmap *pixmap)

{
  qreal qVar1;
  QRect QVar2;
  bool bVar3;
  int iVar4;
  int *in_RCX;
  uint in_EDX;
  int *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  int pixmapHeight;
  int pixmapWidth;
  QSizeF pixmapSize;
  int h;
  int w;
  int y;
  int x;
  QRect result;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  Representation RStack_3c;
  QSizeF local_38;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_1c = -0x55555556;
  local_20 = -0x55555556;
  local_24 = -0x55555556;
  local_28 = -0x55555556;
  QRect::getRect(in_RDI,in_RSI,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),in_RCX,
                 (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_38.wd = -NAN;
  local_38.ht = -NAN;
  local_38.wd = (qreal)QPixmap::deviceIndependentSize();
  qVar1 = QSizeF::width(&local_38);
  iVar4 = (int)qVar1;
  qVar1 = QSizeF::height(&local_38);
  if ((in_EDX & 0x80) == 0x80) {
    in_stack_ffffffffffffff8c = local_28 / 2;
    local_20 = (in_stack_ffffffffffffff8c - (int)qVar1 / 2) + local_20;
  }
  else if ((in_EDX & 0x40) == 0x40) {
    local_20 = (local_28 - (int)qVar1) + local_20;
  }
  if ((in_EDX & 2) == 2) {
    local_1c = (local_24 - iVar4) + local_1c;
  }
  else if ((in_EDX & 4) == 4) {
    in_stack_ffffffffffffff88 = local_24 / 2;
    local_1c = (in_stack_ffffffffffffff88 - iVar4 / 2) + local_1c;
  }
  else if (((in_EDX & 1) != 1) && (bVar3 = QGuiApplication::isRightToLeft(), bVar3)) {
    local_1c = (local_24 - iVar4) + local_1c;
  }
  QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar2.y1.m_i = uStack_44;
  QVar2.x1.m_i = local_48;
  QVar2.x2.m_i = uStack_40;
  QVar2.y2.m_i = RStack_3c.m_i;
  return QVar2;
}

Assistant:

QRect QStyle::itemPixmapRect(const QRect &rect, int alignment, const QPixmap &pixmap) const
{
    QRect result;
    int x, y, w, h;
    rect.getRect(&x, &y, &w, &h);

    QSizeF pixmapSize = pixmap.deviceIndependentSize();
    const int pixmapWidth = pixmapSize.width();
    const int pixmapHeight = pixmapSize.height();

    if ((alignment & Qt::AlignVCenter) == Qt::AlignVCenter)
        y += h/2 - pixmapHeight/2;
    else if ((alignment & Qt::AlignBottom) == Qt::AlignBottom)
        y += h - pixmapHeight;
    if ((alignment & Qt::AlignRight) == Qt::AlignRight)
        x += w - pixmapWidth;
    else if ((alignment & Qt::AlignHCenter) == Qt::AlignHCenter)
        x += w/2 - pixmapWidth/2;
    else if ((alignment & Qt::AlignLeft) != Qt::AlignLeft && QGuiApplication::isRightToLeft())
        x += w - pixmapWidth;
    result = QRect(x, y, pixmapWidth, pixmapHeight);
    return result;
}